

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::ExtPrivkey::ExtPrivkey
          (ExtPrivkey *this,NetType network_type,ByteData *parent_fingerprint,Privkey *privkey,
          ByteData256 *chain_code,uint8_t depth,uint32_t child_num)

{
  pointer *this_00;
  bool bVar1;
  CfdException *pCVar2;
  uchar *puVar3;
  size_type sVar4;
  ByteData256 local_2c8;
  ByteData local_2b0;
  undefined1 local_292;
  allocator local_291;
  string local_290;
  CfdSourceLocation local_270;
  int local_258;
  allocator<unsigned_char> local_251;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  undefined1 local_220 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> chain_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fingerprint_bytes;
  undefined1 local_1d8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_hash;
  undefined1 local_1a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  undefined1 local_178 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  Pubkey pubkey;
  ext_key extkey;
  CfdSourceLocation local_60;
  uint8_t local_31;
  ByteData256 *pBStack_30;
  uint8_t depth_local;
  ByteData256 *chain_code_local;
  Privkey *privkey_local;
  ByteData *parent_fingerprint_local;
  ExtPrivkey *pEStack_10;
  NetType network_type_local;
  ExtPrivkey *this_local;
  
  local_31 = depth;
  pBStack_30 = chain_code;
  chain_code_local = (ByteData256 *)privkey;
  privkey_local = (Privkey *)parent_fingerprint;
  parent_fingerprint_local._4_4_ = network_type;
  pEStack_10 = this;
  ByteData::ByteData(&this->serialize_data_);
  this->version_ = 0;
  this->fingerprint_ = 0;
  this->depth_ = '\0';
  this->child_num_ = 0;
  ByteData256::ByteData256(&this->chaincode_);
  Privkey::Privkey(&this->privkey_);
  ByteData256::ByteData256(&this->tweak_sum_);
  bVar1 = Privkey::IsValid((Privkey *)chain_code_local);
  if (!bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x230;
    local_60.funcname = "ExtPrivkey";
    logger::warn<>(&local_60,"invalid privkey.");
    extkey.pub_key_tweak_sum[0x1a] = '\x01';
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(extkey.pub_key_tweak_sum + 0x1c),
               "Failed to privkey. ExtPrivkey invalid privkey.",
               (allocator *)(extkey.pub_key_tweak_sum + 0x1b));
    CfdException::CfdException
              (pCVar2,kCfdIllegalArgumentError,(string *)(extkey.pub_key_tweak_sum + 0x1c));
    extkey.pub_key_tweak_sum[0x1a] = '\0';
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  memset((void *)((long)&pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),0,0xc0);
  memset((void *)((long)&pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),0,0xc0);
  extkey.hash160[0xc] = 0x94;
  extkey.hash160[0xd] = 0x83;
  extkey.hash160[0xe] = '5';
  extkey.hash160[0xf] = '\x04';
  if ((parent_fingerprint_local._4_4_ == kMainnet) || (parent_fingerprint_local._4_4_ == kLiquidV1))
  {
    builtin_memcpy(extkey.hash160 + 0xc,"䭈\x04",4);
  }
  extkey.parent160[0xc] = local_31;
  extkey.priv_key._25_4_ = child_num;
  Privkey::GeneratePubkey
            ((Pubkey *)
             &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)chain_code_local,true);
  Privkey::GetData((ByteData *)
                   &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(Privkey *)chain_code_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178,
                     (ByteData *)
                     &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &pubkey_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Pubkey::GetData((ByteData *)
                  &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                  (Pubkey *)
                  &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,
                     (ByteData *)
                     &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &pubkey_hash.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  HashUtil::Hash160((ByteData160 *)
                    &fingerprint_bytes.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Pubkey *)
                    &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData160::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8,
             (ByteData160 *)
             &fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData160::~ByteData160
            ((ByteData160 *)
             &fingerprint_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&privkey_local->data_);
  ByteData256::GetData
            ((ByteData *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pBStack_30);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220,
                     (ByteData *)
                     &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData((ByteData *)
                      &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  extkey.pad1[2] = '\0';
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
  memcpy(extkey.pad1 + 3,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
  memcpy(extkey.hash160 + 0x13,puVar3,sVar4);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,4);
  this_00 = &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  memcpy(extkey.chain_code + 0x18,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
  memcpy(extkey.priv_key + 0x1d,puVar3,sVar4);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  memcpy((void *)((long)&pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4),puVar3,sVar4);
  ::std::allocator<unsigned_char>::allocator(&local_251);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0x4e,&local_251);
  ::std::allocator<unsigned_char>::~allocator(&local_251);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  local_258 = bip32_key_serialize((ext_key *)
                                  ((long)&pubkey.data_.data_.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,
                                  puVar3,sVar4);
  if (local_258 != 0) {
    local_270.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_270.filename = local_270.filename + 1;
    local_270.line = 0x253;
    local_270.funcname = "ExtPrivkey";
    logger::warn<int&>(&local_270,"bip32_key_serialize error. ret={}",&local_258);
    local_292 = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_290,"ExtPrivkey serialize error.",&local_291);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_290);
    local_292 = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::ByteData(&local_2b0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ByteData::operator=(&this->serialize_data_,&local_2b0);
  ByteData::~ByteData(&local_2b0);
  ByteData256::ByteData256(&local_2c8);
  ByteData256::operator=(&this->tweak_sum_,&local_2c8);
  ByteData256::~ByteData256(&local_2c8);
  AnalyzeBip32KeyData((void *)((long)&pubkey.data_.data_.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                      (string *)0x0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0,
                      &this->version_,&this->depth_,&this->child_num_,&this->chaincode_,
                      &this->privkey_,(Pubkey *)0x0,&this->fingerprint_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_220);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &chain_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
  Pubkey::~Pubkey((Pubkey *)
                  &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(
    NetType network_type, const ByteData& parent_fingerprint,
    const Privkey& privkey, const ByteData256& chain_code, uint8_t depth,
    uint32_t child_num) {
  if (!privkey.IsValid()) {
    warn(CFD_LOG_SOURCE, "invalid privkey.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to privkey. ExtPrivkey invalid privkey.");
  }

  // create simple parent data
  struct ext_key extkey = {};
  memset(&extkey, 0, sizeof(extkey));
  extkey.version = kVersionTestnetPrivkey;
  if ((network_type == NetType::kMainnet) ||
      (network_type == NetType::kLiquidV1)) {
    extkey.version = kVersionMainnetPrivkey;
  }
  extkey.depth = depth;
  extkey.child_num = child_num;
  Pubkey pubkey = privkey.GeneratePubkey(true);
  std::vector<uint8_t> privkey_bytes = privkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_bytes = pubkey.GetData().GetBytes();
  std::vector<uint8_t> pubkey_hash = HashUtil::Hash160(pubkey).GetBytes();
  std::vector<uint8_t> fingerprint_bytes = parent_fingerprint.GetBytes();
  std::vector<uint8_t> chain_bytes = chain_code.GetData().GetBytes();
  extkey.priv_key[0] = BIP32_FLAG_KEY_PRIVATE;
  memcpy(&extkey.priv_key[1], privkey_bytes.data(), privkey_bytes.size());
  memcpy(extkey.pub_key, pubkey_bytes.data(), pubkey_bytes.size());
  // parent160: use top 4-byte only
  fingerprint_bytes.resize(4);
  memcpy(extkey.parent160, fingerprint_bytes.data(), fingerprint_bytes.size());
  memcpy(extkey.hash160, pubkey_hash.data(), pubkey_hash.size());
  memcpy(extkey.chain_code, chain_bytes.data(), chain_bytes.size());

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  int ret = bip32_key_serialize(
      &extkey, BIP32_FLAG_KEY_PRIVATE, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }
  serialize_data_ = ByteData(data);
  tweak_sum_ = ByteData256();

  AnalyzeBip32KeyData(
      &extkey, nullptr, nullptr, &version_, &depth_, &child_num_, &chaincode_,
      &privkey_, nullptr, &fingerprint_);
}